

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::compute_persistence
          (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,unsigned_short min_dimension,unsigned_short max_dimension,
          bool check_euler_characteristic)

{
  int iVar1;
  pointer puVar2;
  ostream *poVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  long lVar5;
  undefined6 in_register_00000032;
  int iVar6;
  ulong uVar7;
  index_t cell_euler_characteristic;
  int iVar8;
  unsigned_long local_38;
  
  uVar7 = CONCAT71(in_register_00000009,check_euler_characteristic) & 0xffffffff;
  compute_zeroth_persistence(this,min_dimension,max_dimension);
  compute_higher_persistence(this,min_dimension,max_dimension);
  (*this->output->_vptr_output_t[4])(this->output,uVar7);
  if (((((int)CONCAT62(in_register_00000032,min_dimension) == 0) && (max_dimension == 0xffff)) &&
      ((char)uVar7 != '\0')) && (this->max_entries == 0xffffffffffffffff)) {
    puVar2 = (this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar8 = 0;
    for (uVar7 = 0;
        (long)(this->complex->cell_count).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar2 >> 3 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = *(int *)((long)puVar2 + (lVar5 >> 0x1d));
      iVar6 = -iVar1;
      if ((uVar7 & 1) == 0) {
        iVar6 = iVar1;
      }
      iVar8 = iVar8 + iVar6;
      lVar5 = lVar5 + 0x100000000;
    }
    if (this->print_betti_numbers_to_console != false) {
      poVar3 = std::operator<<((ostream *)&std::cout,"The Euler characteristic is given by: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    if (iVar8 != this->euler_characteristic) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "ERROR: The homological Euler characteristic (which is ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->euler_characteristic);
      poVar3 = std::operator<<(poVar3,") differs from the cellular Euler characteristic (which is ")
      ;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
      poVar3 = std::operator<<(poVar3,"), apparently there is an error in the program.");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  uVar7 = (ulong)min_dimension;
  while( true ) {
    puVar2 = (this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->complex->cell_count).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar2 >> 3) - 1;
    if ((ulong)max_dimension + 1 < uVar4) {
      uVar4 = (ulong)max_dimension + 1;
    }
    if (uVar4 <= uVar7) break;
    local_38 = (unsigned_long)(int)puVar2[uVar7];
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->cell_count,&local_38);
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void compute_persistence(unsigned short min_dimension = 0,
	                         unsigned short max_dimension = std::numeric_limits<unsigned short>::max(),
	                         bool check_euler_characteristic = true) {
		compute_zeroth_persistence(min_dimension, max_dimension);
		compute_higher_persistence(min_dimension, max_dimension);
		complex.finished();
		output->finished(check_euler_characteristic);

		// Sanity check whether there were any problems computing the homology
		bool computed_full_homology = min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
		if (check_euler_characteristic && computed_full_homology && max_entries == std::numeric_limits<size_t>::max()) {
			index_t cell_euler_characteristic = 0;
			for (size_t i = 0; i <= complex.top_dimension(); i++) {
				cell_euler_characteristic += (i % 2 == 1 ? -1 : 1) * index_t(complex.number_of_cells(index_t(i)));
			}

			if (print_betti_numbers_to_console)
				std::cout << "The Euler characteristic is given by: " << cell_euler_characteristic << std::endl;

			if (cell_euler_characteristic != euler_characteristic) {
				std::cerr << "ERROR: The homological Euler characteristic (which is " << euler_characteristic
				          << ") differs from the cellular Euler characteristic (which is " << cell_euler_characteristic
				          << "), apparently there is an error in the program." << std::endl;
			}
		}

#ifdef RETRIEVE_PERSISTENCE
		for (size_t i = min_dimension; i < std::min(complex.top_dimension(), (size_t)max_dimension + 1); i++) {
			cell_count.push_back(index_t(complex.number_of_cells(index_t(i))));
		}
#endif
	}